

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall tinyusdz::Stage::compute_absolute_prim_path(Stage *this)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  reference prim;
  Prim *root;
  iterator __end1;
  iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  string local_130;
  allocator local_109;
  string local_108;
  undefined1 local_e8 [8];
  Path rootPath;
  Stage *this_local;
  
  rootPath._200_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"/",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)((long)&__range1 + 7));
  Path::Path((Path *)local_e8,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this_00 = root_prims(this);
  __end1 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_00);
  root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                *)&root);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_002406bd:
      Path::~Path((Path *)local_e8);
      return this_local._7_1_;
    }
    prim = __gnu_cxx::
           __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
           ::operator*(&__end1);
    bVar1 = anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
                      (this,prim,(Path *)local_e8,1,false,true,&this->_err);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002406bd;
    }
    __gnu_cxx::
    __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Stage::compute_absolute_prim_path() {
  Path rootPath("/", "");
  for (Prim &root : root_prims()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(
            *this, root, rootPath, 1, /* assign prim_id */ false,
            /* force_assign_prim_id */ true, &_err)) {
      return false;
    }
  }

  return true;
}